

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn,_cfd::js::api::ElementsDecodeRawTransactionTxInStruct>
::ConvertFromStruct(JsonObjectVector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn,_cfd::js::api::ElementsDecodeRawTransactionTxInStruct>
                    *this,vector<cfd::js::api::ElementsDecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::ElementsDecodeRawTransactionTxInStruct>_>
                          *list)

{
  bool bVar1;
  undefined1 local_2f0 [8];
  ElementsDecodeRawTransactionTxIn object;
  ElementsDecodeRawTransactionTxInStruct *element;
  const_iterator __end0;
  const_iterator __begin0;
  vector<cfd::js::api::ElementsDecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::ElementsDecodeRawTransactionTxInStruct>_>
  *__range3;
  vector<cfd::js::api::ElementsDecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::ElementsDecodeRawTransactionTxInStruct>_>
  *list_local;
  JsonObjectVector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn,_cfd::js::api::ElementsDecodeRawTransactionTxInStruct>
  *this_local;
  
  __end0 = std::
           vector<cfd::js::api::ElementsDecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::ElementsDecodeRawTransactionTxInStruct>_>
           ::begin(list);
  element = (ElementsDecodeRawTransactionTxInStruct *)
            std::
            vector<cfd::js::api::ElementsDecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::ElementsDecodeRawTransactionTxInStruct>_>
            ::end(list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_cfd::js::api::ElementsDecodeRawTransactionTxInStruct_*,_std::vector<cfd::js::api::ElementsDecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::ElementsDecodeRawTransactionTxInStruct>_>_>
                                *)&element);
    if (!bVar1) break;
    object.issuance_._360_8_ =
         __gnu_cxx::
         __normal_iterator<const_cfd::js::api::ElementsDecodeRawTransactionTxInStruct_*,_std::vector<cfd::js::api::ElementsDecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::ElementsDecodeRawTransactionTxInStruct>_>_>
         ::operator*(&__end0);
    js::api::json::ElementsDecodeRawTransactionTxIn::ElementsDecodeRawTransactionTxIn
              ((ElementsDecodeRawTransactionTxIn *)local_2f0);
    js::api::json::ElementsDecodeRawTransactionTxIn::ConvertFromStruct
              ((ElementsDecodeRawTransactionTxIn *)local_2f0,
               (ElementsDecodeRawTransactionTxInStruct *)object.issuance_._360_8_);
    std::
    vector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::js::api::json::ElementsDecodeRawTransactionTxIn>_>
    ::push_back(&(this->super_JsonVector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn>).
                 super_vector<cfd::js::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::js::api::json::ElementsDecodeRawTransactionTxIn>_>
                ,(value_type *)local_2f0);
    js::api::json::ElementsDecodeRawTransactionTxIn::~ElementsDecodeRawTransactionTxIn
              ((ElementsDecodeRawTransactionTxIn *)local_2f0);
    __gnu_cxx::
    __normal_iterator<const_cfd::js::api::ElementsDecodeRawTransactionTxInStruct_*,_std::vector<cfd::js::api::ElementsDecodeRawTransactionTxInStruct,_std::allocator<cfd::js::api::ElementsDecodeRawTransactionTxInStruct>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }